

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

float fastatan(float x)

{
  bool bVar1;
  float fVar2;
  float r;
  float x2;
  float *c;
  float sign;
  float x_local;
  
  c._0_4_ = 1.0;
  c._4_4_ = x;
  if (x < 0.0) {
    c._0_4_ = -1.0;
    c._4_4_ = -x;
  }
  bVar1 = 1.0 <= c._4_4_;
  fVar2 = c._4_4_ * c._4_4_;
  return (((fastatan::coeffs[bVar1][1] * fVar2 + fastatan::coeffs[bVar1][0]) * c._4_4_) /
          ((fastatan::coeffs[bVar1][4] * fVar2 + fastatan::coeffs[bVar1][3]) * fVar2 +
          fastatan::coeffs[bVar1][2]) + fastatan::coeffs[bVar1][5]) * c._0_4_;
}

Assistant:

static float fastatan(float x)
{
    // extract sign
    float sign = 1.0f;
    if (x < 0.0f)
    {
        sign = -1.0f;
        x = -x;
    }

    // we have two rational approximations: one for |x| < 1.0 and one for
    // |x| >= 1.0, both of the general form
    //   r(x) = (cx1*x + cx3*x^3) / (cxm0 + cxm2*x^2 + cxm4*x^4) + bias
    // original V2 code uses doubles here but frankly the coefficients
    // just aren't accurate enough to warrant it :)
    static const float coeffs[2][6] = {
        //          cx1          cx3         cxm0         cxm2         cxm4         bias
        {          1.0f, 0.43157974f,        1.0f, 0.05831938f, 0.76443945f,        0.0f },
        { -0.431597974f,       -1.0f, 0.05831938f,        1.0f, 0.76443945f, 1.57079633f },
    };
    const float *c = coeffs[x >= 1.0f]; // interestingly enough, V2 code does this test wrong (cmovge instead of cmovae)
    float x2 = x*x;
    float r = (c[1]*x2 + c[0])*x / ((c[4]*x2 + c[3])*x2 + c[2]) + c[5];
    return r * sign;
}